

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

void __thiscall QNetworkAccessManager::~QNetworkAccessManager(QNetworkAccessManager *this)

{
  QNetworkAccessManagerPrivate *pQVar1;
  QObject *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffb8;
  FindChildOption flags;
  QObject *this_00;
  long lVar2;
  
  flags = (FindChildOption)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_0049a180;
  this_00 = in_RDI;
  pQVar1 = d_func((QNetworkAccessManager *)0x19b3f8);
  if (pQVar1->proxyFactory != (QNetworkProxyFactory *)0x0) {
    (*pQVar1->proxyFactory->_vptr_QNetworkProxyFactory[1])();
  }
  QFlags<Qt::FindChildOption>::QFlags((QFlags<Qt::FindChildOption> *)in_RDI,flags);
  QObject::findChildren<QNetworkReply*>
            (this_00,(QFlagsStorageHelper<Qt::FindChildOption,_4>)SUB84((ulong)lVar2 >> 0x20,0));
  qDeleteAll<QList<QNetworkReply*>>((QList<QNetworkReply_*> *)in_RDI);
  QList<QNetworkReply_*>::~QList((QList<QNetworkReply_*> *)0x19b44d);
  QObject::~QObject(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessManager::~QNetworkAccessManager()
{
#ifndef QT_NO_NETWORKPROXY
    delete d_func()->proxyFactory;
#endif

    // Delete the QNetworkReply children first.
    // Else a QAbstractNetworkCache might get deleted in ~QObject
    // before a QNetworkReply that accesses the QAbstractNetworkCache
    // object in its destructor.
    qDeleteAll(findChildren<QNetworkReply *>());
    // The other children will be deleted in this ~QObject
    // FIXME instead of this "hack" make the QNetworkReplyImpl
    // properly watch the cache deletion, e.g. via a QWeakPointer.
}